

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O0

opj_bool tcd_code_block_dec_allocate(opj_tcd_cblk_dec_v2_t *p_code_block)

{
  void *pvVar1;
  long *in_RDI;
  OPJ_UINT32 l_seg_size;
  
  if (*in_RDI == 0) {
    pvVar1 = malloc(0x2000);
    *in_RDI = (long)pvVar1;
    if (*in_RDI == 0) {
      return 0;
    }
    pvVar1 = malloc(400);
    in_RDI[1] = (long)pvVar1;
    if (in_RDI[1] == 0) {
      return 0;
    }
    memset((void *)in_RDI[1],0,400);
    *(undefined4 *)(in_RDI + 7) = 10;
  }
  return 1;
}

Assistant:

opj_bool tcd_code_block_dec_allocate (opj_tcd_cblk_dec_v2_t * p_code_block)
{
	OPJ_UINT32 l_seg_size;

	if (! p_code_block->data) {

		p_code_block->data = (OPJ_BYTE*) opj_malloc(8192);
		if (! p_code_block->data) {
			return OPJ_FALSE;
		}
		/*fprintf(stderr, "Allocate 8192 elements of code_block->data\n");*/

		l_seg_size = J2K_DEFAULT_NB_SEGS * sizeof(opj_tcd_seg_t);
		p_code_block->segs = (opj_tcd_seg_t *) opj_malloc(l_seg_size);
		if (! p_code_block->segs) {
			return OPJ_FALSE;
		}
		memset(p_code_block->segs,0,l_seg_size);
		/*fprintf(stderr, "Allocate %d elements of code_block->data\n", J2K_DEFAULT_NB_SEGS * sizeof(opj_tcd_seg_t));*/

		p_code_block->m_current_max_segs = J2K_DEFAULT_NB_SEGS;
		/*fprintf(stderr, "m_current_max_segs of code_block->data = %d\n", p_code_block->m_current_max_segs);*/
	}
	/* TODO */
	/*p_code_block->numsegs = 0; */

	return OPJ_TRUE;
}